

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::AddUTF8(SQLexer *this,SQUnsignedInteger ch)

{
  byte local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  char local_21;
  SQUnsignedInteger local_20;
  SQUnsignedInteger ch_local;
  SQLexer *this_local;
  
  local_20 = ch;
  ch_local = (SQUnsignedInteger)this;
  if (ch < 0x80) {
    local_21 = (char)ch;
    sqvector<char>::push_back(&this->_longstr,&local_21);
    this_local = (SQLexer *)0x1;
  }
  else if (ch < 0x800) {
    local_22 = (byte)(ch >> 6) | 0xc0;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_22);
    local_23 = (byte)local_20 & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_23);
    this_local = (SQLexer *)0x2;
  }
  else if (ch < 0x10000) {
    local_24 = (byte)(ch >> 0xc) | 0xe0;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_24);
    local_25 = (byte)(local_20 >> 6) & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_25);
    local_26 = (byte)local_20 & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_26);
    this_local = (SQLexer *)0x3;
  }
  else if (ch < 0x110000) {
    local_27 = (byte)(ch >> 0x12) | 0xf0;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_27);
    local_28 = (byte)(local_20 >> 0xc) & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_28);
    local_29 = (byte)(local_20 >> 6) & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_29);
    local_2a = (byte)local_20 & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_2a);
    this_local = (SQLexer *)0x4;
  }
  else {
    this_local = (SQLexer *)0x0;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQLexer::AddUTF8(SQUnsignedInteger ch)
{
    if (ch < 0x80) {
        APPEND_CHAR((char)ch);
        return 1;
    }
    if (ch < 0x800) {
        APPEND_CHAR((SQChar)((ch >> 6) | 0xC0));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 2;
    }
    if (ch < 0x10000) {
        APPEND_CHAR((SQChar)((ch >> 12) | 0xE0));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 3;
    }
    if (ch < 0x110000) {
        APPEND_CHAR((SQChar)((ch >> 18) | 0xF0));
        APPEND_CHAR((SQChar)(((ch >> 12) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 4;
    }
    return 0;
}